

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderSingle.h
# Opt level: O2

void __thiscall FIX42::NewOrderSingle::NoAllocs::NoAllocs(NoAllocs *this)

{
  message_order mStack_38;
  
  FIX::message_order::message_order(&mStack_38,0x4f,0x50,0);
  FIX::Group::Group(&this->super_Group,0x4e,0x4f,&mStack_38);
  FIX::shared_array<int>::~shared_array(&mStack_38.m_groupOrder);
  *(undefined ***)&this->super_Group = &PTR__FieldMap_002f8038;
  return;
}

Assistant:

NoAllocs() : FIX::Group(78,79,FIX::message_order(79,80,0)) {}